

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomdiscard(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  expr *peVar2;
  void *pvVar3;
  long in_RDI;
  etype in_R8D;
  expr *expr;
  int in_stack_00000084;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    peVar2 = makeex(in_R8D);
    if (*(int *)(in_RDI + 0x74) <= *(int *)(in_RDI + 0x70)) {
      if (*(int *)(in_RDI + 0x74) == 0) {
        *(undefined4 *)(in_RDI + 0x74) = 0x10;
      }
      else {
        *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) << 1;
      }
      pvVar3 = realloc(*(void **)(in_RDI + 0x68),(long)*(int *)(in_RDI + 0x74) << 3);
      *(void **)(in_RDI + 0x68) = pvVar3;
    }
    iVar1 = *(int *)(in_RDI + 0x70);
    *(int *)(in_RDI + 0x70) = iVar1 + 1;
    *(expr **)(*(long *)(in_RDI + 0x68) + (long)iVar1 * 8) = peVar2;
    local_8 = (matches *)0x0;
  }
  else if (in_R8D == *(etype *)(*(long *)(in_RDI + 0x50) + 0x18)) {
    local_8 = (matches *)0x0;
  }
  else if (**(int **)(*(long *)(*(long *)(in_RDI + 0x50) + 0x10) + (long)(int)in_R8D * 8) == 6) {
    local_8 = alwaysmatches(in_stack_00000084);
  }
  else {
    local_8 = (matches *)0x0;
  }
  return local_8;
}

Assistant:

struct matches *atomdiscard APROTO {
	if (ctx->reverse) {
		if (spos == ctx->line->atomsnum)
			return 0;
		if (ctx->line->atoms[spos]->type == EXPR_DISCARD) {
			return alwaysmatches(spos+1);
		} else {
			return 0;
		}
	}
	struct expr *expr = makeex(EXPR_DISCARD);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}